

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O0

Gia_Man_t * Gia_QbfQuantifyOne(Gia_Man_t *p,int iVar,int fAndAll,int fOrAll)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *p_01;
  Gia_Man_t *pGVar5;
  bool bVar6;
  uint local_48;
  int local_44;
  int c;
  int i;
  Vec_Int_t *vCofs;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  int fOrAll_local;
  int fAndAll_local;
  int iVar_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  Gia_ManHashAlloc(p_00);
  Gia_ManFillValue(p);
  pGVar4 = Gia_ManConst0(p);
  pGVar4->Value = 0;
  local_44 = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p);
    bVar6 = false;
    if (local_44 < iVar1) {
      vCofs = (Vec_Int_t *)Gia_ManCi(p,local_44);
      bVar6 = vCofs != (Vec_Int_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ManAppendCi(p_00);
    *(int *)&vCofs->pArray = iVar1;
    local_44 = local_44 + 1;
  }
  iVar1 = Gia_ManPoNum(p);
  p_01 = Vec_IntAlloc(iVar1 << 1);
  for (local_48 = 0; (int)local_48 < 2; local_48 = local_48 + 1) {
    pGVar4 = Gia_ManPi(p,iVar);
    pGVar4->Value = local_48;
    local_44 = 0;
    while( true ) {
      bVar6 = false;
      if (local_44 < p->nObjs) {
        vCofs = (Vec_Int_t *)Gia_ManObj(p,local_44);
        bVar6 = vCofs != (Vec_Int_t *)0x0;
      }
      if (!bVar6) break;
      iVar1 = Gia_ObjIsAnd((Gia_Obj_t *)vCofs);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjFanin0Copy((Gia_Obj_t *)vCofs);
        iVar2 = Gia_ObjFanin1Copy((Gia_Obj_t *)vCofs);
        iVar1 = Gia_ManHashAnd(p_00,iVar1,iVar2);
        *(int *)&vCofs->pArray = iVar1;
      }
      local_44 = local_44 + 1;
    }
    local_44 = 0;
    while( true ) {
      iVar1 = Gia_ManPoNum(p);
      bVar6 = false;
      if (local_44 < iVar1) {
        vCofs = (Vec_Int_t *)Gia_ManCo(p,local_44);
        bVar6 = vCofs != (Vec_Int_t *)0x0;
      }
      if (!bVar6) break;
      iVar1 = Gia_ObjFanin0Copy((Gia_Obj_t *)vCofs);
      Vec_IntPush(p_01,iVar1);
      local_44 = local_44 + 1;
    }
  }
  if (fAndAll == 0) {
    if (fOrAll == 0) {
      for (local_44 = 0; iVar1 = Vec_IntSize(p_01), local_44 < iVar1; local_44 = local_44 + 1) {
        iVar1 = Vec_IntEntry(p_01,local_44);
        Gia_ManAppendCo(p_00,iVar1);
      }
    }
    else {
      for (local_44 = 0; iVar1 = Gia_ManPoNum(p), local_44 < iVar1; local_44 = local_44 + 1) {
        iVar1 = Vec_IntEntry(p_01,local_44);
        iVar2 = Gia_ManPoNum(p);
        iVar2 = Vec_IntEntry(p_01,iVar2 + local_44);
        iVar1 = Gia_ManHashOr(p_00,iVar1,iVar2);
        Gia_ManAppendCo(p_00,iVar1);
      }
    }
  }
  else {
    for (local_44 = 0; iVar1 = Gia_ManPoNum(p), local_44 < iVar1; local_44 = local_44 + 1) {
      iVar1 = Vec_IntEntry(p_01,local_44);
      iVar2 = Gia_ManPoNum(p);
      iVar2 = Vec_IntEntry(p_01,iVar2 + local_44);
      iVar1 = Gia_ManHashAnd(p_00,iVar1,iVar2);
      Gia_ManAppendCo(p_00,iVar1);
    }
  }
  Vec_IntFree(p_01);
  pGVar5 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar5;
}

Assistant:

Gia_Man_t * Gia_QbfQuantifyOne( Gia_Man_t * p, int iVar, int fAndAll, int fOrAll )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj; 
    Vec_Int_t * vCofs;
    int i, c;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // compute cofactors
    vCofs = Vec_IntAlloc( 2 * Gia_ManPoNum(p) );
    for ( c = 0; c < 2; c++ )
    {
        Gia_ManPi(p, iVar)->Value = c;
        Gia_ManForEachAnd( p, pObj, i )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachPo( p, pObj, i )
            Vec_IntPush( vCofs, Gia_ObjFanin0Copy(pObj) );
    }
    if ( fAndAll )
    {
        for ( i = 0; i < Gia_ManPoNum(p); i++ )
            Gia_ManAppendCo( pNew, Gia_ManHashAnd(pNew, Vec_IntEntry(vCofs, i), Vec_IntEntry(vCofs, Gia_ManPoNum(p)+i)) );
    }
    else if ( fOrAll )
    {
        for ( i = 0; i < Gia_ManPoNum(p); i++ )
            Gia_ManAppendCo( pNew, Gia_ManHashOr(pNew, Vec_IntEntry(vCofs, i), Vec_IntEntry(vCofs, Gia_ManPoNum(p)+i)) );
    }
    else
    {
        Vec_IntForEachEntry( vCofs, c, i )
            Gia_ManAppendCo( pNew, c );
    }
    Vec_IntFree( vCofs );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}